

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O1

int fd_send(int sock,int *fds,size_t nfds)

{
  ulong uVar1;
  int *piVar2;
  cmsghdr *__cmsg;
  ssize_t sVar3;
  ulong uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  iovec iov;
  msghdr msg;
  undefined1 local_131;
  int local_130;
  int local_12c;
  ulong local_128;
  size_t local_120;
  int *local_118;
  size_t local_110;
  ulong local_108;
  iovec local_100;
  msghdr local_f0;
  fd_set local_b8;
  
  local_118 = fds;
  if (fds == (int *)0x0 || nfds == 0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar5 = -1;
  }
  else {
    local_128 = 1L << ((byte)sock & 0x3f);
    local_108 = (ulong)((uint)sock >> 6);
    local_12c = sock + 1;
    sVar6 = 0;
    local_120 = nfds;
    do {
      uVar4 = nfds - sVar6;
      if (0x5e7 < uVar4) {
        uVar4 = 0x5e8;
      }
      if (sock < 0) {
        __assert_fail("sock >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                      ,0xec,"int fd_package_send(int, const int *, size_t)");
      }
      if (nfds == sVar6) {
        __assert_fail("nfds > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                      ,0xee,"int fd_package_send(int, const int *, size_t)");
      }
      bzero(&local_f0,0x38);
      local_131 = 0;
      local_100.iov_base = &local_131;
      local_100.iov_len = 1;
      local_f0.msg_iov = &local_100;
      local_f0.msg_iovlen = 1;
      local_f0.msg_controllen = uVar4 * 0x18;
      __cmsg = (cmsghdr *)calloc(1,local_f0.msg_controllen);
      piVar2 = local_118;
      local_110 = sVar6;
      local_f0.msg_control = __cmsg;
      if (__cmsg == (cmsghdr *)0x0) {
        iVar5 = -1;
      }
      else {
        uVar7 = 1;
        do {
          iVar5 = piVar2[sVar6 + (uVar7 - 1)];
          if (iVar5 < 0) {
            __assert_fail("fd >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                          ,0x50,"int msghdr_add_fd(struct cmsghdr *, int)");
          }
          __cmsg->cmsg_level = 1;
          __cmsg->cmsg_type = 1;
          __cmsg->cmsg_len = 0x14;
          *(int *)&__cmsg[1].cmsg_len = iVar5;
          __cmsg = __cmsg_nxthdr(&local_f0,__cmsg);
          uVar1 = local_128;
        } while ((uVar7 < uVar4) && (uVar7 = uVar7 + 1, __cmsg != (cmsghdr *)0x0));
        do {
          local_b8.fds_bits[0xe] = 0;
          local_b8.fds_bits[0xf] = 0;
          local_b8.fds_bits[0xc] = 0;
          local_b8.fds_bits[0xd] = 0;
          local_b8.fds_bits[10] = 0;
          local_b8.fds_bits[0xb] = 0;
          local_b8.fds_bits[8] = 0;
          local_b8.fds_bits[9] = 0;
          local_b8.fds_bits[6] = 0;
          local_b8.fds_bits[7] = 0;
          local_b8.fds_bits[4] = 0;
          local_b8.fds_bits[5] = 0;
          local_b8.fds_bits[2] = 0;
          local_b8.fds_bits[3] = 0;
          local_b8.fds_bits[0] = 0;
          local_b8.fds_bits[1] = 0;
          local_b8.fds_bits[local_108] = local_b8.fds_bits[local_108] | uVar1;
          select(local_12c,(fd_set *)0x0,&local_b8,(fd_set *)0x0,(timeval *)0x0);
          sVar3 = sendmsg(sock,&local_f0,0);
          if (sVar3 != -1) break;
          piVar2 = __errno_location();
        } while (*piVar2 == 4);
        iVar5 = -(uint)(sVar3 == -1);
        piVar2 = __errno_location();
        local_130 = *piVar2;
        free(local_f0.msg_control);
        *piVar2 = local_130;
        nfds = local_120;
      }
      if (iVar5 != 0) {
        return iVar5;
      }
      sVar6 = (size_t)(uint)((int)local_110 + (int)uVar4);
    } while (sVar6 < nfds);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int
fd_send(int sock, const int *fds, size_t nfds)
{
	unsigned int i, step;
	int ret;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_send(sock, fds + i, step);
		if (ret != 0)
			break;
		i += step;
	}

	return (ret);
}